

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::XThreadFulfiller<int>::fulfill(XThreadFulfiller<int> *this,FixVoid<int> *value)

{
  bool bVar1;
  int *value_00;
  XThreadPafImpl<int> *pXVar2;
  ExceptionOr<int> local_1d0;
  FulfillScope local_20;
  FulfillScope scope;
  FixVoid<int> *value_local;
  XThreadFulfiller<int> *this_local;
  
  scope.obj = (XThreadPaf *)value;
  XThreadPaf::FulfillScope::FulfillScope(&local_20,&this->target);
  bVar1 = XThreadPaf::FulfillScope::shouldFulfill(&local_20);
  if (bVar1) {
    value_00 = mv<int>((int *)scope.obj);
    ExceptionOr<int>::ExceptionOr(&local_1d0,value_00);
    pXVar2 = XThreadPaf::FulfillScope::getTarget<int>(&local_20);
    ExceptionOr<int>::operator=(&pXVar2->result,&local_1d0);
    ExceptionOr<int>::~ExceptionOr(&local_1d0);
  }
  XThreadPaf::FulfillScope::~FulfillScope(&local_20);
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) const override {
    XThreadPaf::FulfillScope scope(&target);
    if (scope.shouldFulfill()) {
      scope.getTarget<T>()->result = kj::mv(value);
    }
  }